

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O1

int cfg_db_remove_sectiontype(cfg_db *db,char *section_type)

{
  int iVar1;
  cfg_section_type *section;
  
  section = (cfg_section_type *)avl_find(&db->sectiontypes,section_type);
  if (section == (cfg_section_type *)0x0) {
    iVar1 = -1;
  }
  else {
    _free_sectiontype(section);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_db_remove_sectiontype(struct cfg_db *db, const char *section_type) {
  struct cfg_section_type *section;

  /* find section */
  section = cfg_db_find_sectiontype(db, section_type);
  if (section == NULL) {
    return -1;
  }

  _free_sectiontype(section);
  return 0;
}